

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo.h
# Opt level: O2

void __thiscall
TxInUndoFormatter::Unser<HashVerifier<AutoFile>>
          (TxInUndoFormatter *this,HashVerifier<AutoFile> *s,Coin *txout)

{
  long lVar1;
  uint uVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = ReadVarInt<HashVerifier<AutoFile>,(VarIntMode)0,unsigned_int>(s);
  *(uint *)&txout->field_0x28 = uVar2;
  if (1 < uVar2) {
    ReadVarInt<HashVerifier<AutoFile>,(VarIntMode)0,unsigned_int>(s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    TxOutCompression::SerializationOps<HashVerifier<AutoFile>,CTxOut,ActionUnserialize>(txout,s);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream &s, Coin& txout) {
        uint32_t nCode = 0;
        ::Unserialize(s, VARINT(nCode));
        txout.nHeight = nCode >> 1;
        txout.fCoinBase = nCode & 1;
        if (txout.nHeight > 0) {
            // Old versions stored the version number for the last spend of
            // a transaction's outputs. Non-final spends were indicated with
            // height = 0.
            unsigned int nVersionDummy;
            ::Unserialize(s, VARINT(nVersionDummy));
        }
        ::Unserialize(s, Using<TxOutCompression>(txout.out));
    }